

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeDecomposition.cpp
# Opt level: O0

void __thiscall TreeDecomposition::buildFromFile(TreeDecomposition *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  var_bitset schema;
  bitset<100UL> *pbVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  istream *piVar7;
  char *pcVar8;
  unsigned_long uVar9;
  value_type pAVar10;
  reference ppAVar11;
  mapped_type *pmVar12;
  value_type pTVar13;
  reference ppTVar14;
  size_type sVar15;
  ulong uVar16;
  bitset<100UL> *pbVar17;
  long *in_RDI;
  vector<TDNode_*,_std::allocator<TDNode_*>_> *this_00;
  size_t n_2;
  size_t n_1;
  var_bitset rootSchemaBitset;
  size_t threads;
  int relID;
  size_t i_3;
  int n2;
  int n1;
  size_t i_2;
  string node2;
  string node1;
  size_t i_1;
  Type t;
  size_t i;
  string eString;
  string mString;
  string nString;
  string index;
  string attrs;
  string type;
  string name;
  string attribute;
  stringstream ssLine;
  string line;
  size_t e;
  size_t m;
  size_t n;
  ifstream input;
  TDNode *in_stack_fffffffffffff7d8;
  TreeDecomposition *in_stack_fffffffffffff7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7e8;
  undefined4 in_stack_fffffffffffff7f0;
  int in_stack_fffffffffffff7f4;
  TDNode *in_stack_fffffffffffff7f8;
  Type in_stack_fffffffffffff800;
  int in_stack_fffffffffffff804;
  TDNode *in_stack_fffffffffffff808;
  undefined7 in_stack_fffffffffffff810;
  undefined1 in_stack_fffffffffffff817;
  istream *in_stack_fffffffffffff818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff820;
  bitset<100UL> *in_stack_fffffffffffff828;
  bitset<100UL> *local_7c8;
  ulong local_640;
  ulong local_638;
  string local_620 [32];
  string local_600 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5e0;
  int local_5d4;
  ulong local_5d0;
  long local_5c8;
  long local_5c0;
  int local_5b8;
  int local_5b4;
  ulong local_5b0;
  string local_5a8 [32];
  string local_588 [39];
  undefined1 local_561;
  string local_560 [32];
  ulong local_540;
  undefined1 local_531;
  string local_530 [36];
  undefined4 local_50c;
  ulong local_508;
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  long local_400 [2];
  ostream local_3f0 [376];
  string local_278 [32];
  unsigned_long local_258;
  unsigned_long local_250;
  unsigned_long local_248;
  string local_240 [48];
  long local_210 [66];
  
  std::ifstream::ifstream(local_210,(string *)multifaq::config::TREEDECOMP_CONF_abi_cxx11_,_S_in);
  bVar4 = std::ios::operator!((ios *)((long)local_210 + *(long *)(local_210[0] + -0x18)));
  if ((bVar4 & 1) != 0) {
    std::operator+(&in_stack_fffffffffffff808->_name,
                   (char *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
    std::operator<<((ostream *)&std::cerr,local_240);
    std::__cxx11::string::~string(local_240);
    exit(1);
  }
  std::__cxx11::string::string(local_278);
  std::__cxx11::stringstream::stringstream((stringstream *)local_400);
  std::__cxx11::string::string(local_420);
  std::__cxx11::string::string(local_440);
  std::__cxx11::string::string(local_460);
  std::__cxx11::string::string(local_480);
  std::__cxx11::string::string(local_4a0);
  local_7c8 = in_stack_fffffffffffff828;
  do {
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_210,local_278);
    bVar5 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
    if (!bVar5) break;
    pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_278);
  } while ((*pcVar8 == '#') ||
          (bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff7e0,(char *)in_stack_fffffffffffff7d8),
          bVar5));
  std::operator<<(local_3f0,local_278);
  std::__cxx11::string::string(local_4c0);
  std::__cxx11::string::string(local_4e0);
  std::__cxx11::string::string(local_500);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_400,local_4c0,' ')
  ;
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_400,local_4e0,' ')
  ;
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_400,local_500,' ')
  ;
  std::ios::clear((long)local_400 + *(long *)(local_400[0] + -0x18),0);
  local_248 = std::__cxx11::stoul((string *)in_stack_fffffffffffff7e0,
                                  (size_t *)in_stack_fffffffffffff7d8,0);
  local_250 = std::__cxx11::stoul((string *)in_stack_fffffffffffff7e0,
                                  (size_t *)in_stack_fffffffffffff7d8,0);
  local_258 = std::__cxx11::stoul((string *)in_stack_fffffffffffff7e0,
                                  (size_t *)in_stack_fffffffffffff7d8,0);
  in_RDI[4] = local_248;
  in_RDI[5] = local_250;
  in_RDI[6] = local_258;
  std::vector<TDNode_*,_std::allocator<TDNode_*>_>::resize
            ((vector<TDNode_*,_std::allocator<TDNode_*>_> *)
             CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
             (size_type)in_stack_fffffffffffff7f8);
  std::vector<Attribute_*,_std::allocator<Attribute_*>_>::resize
            ((vector<Attribute_*,_std::allocator<Attribute_*>_> *)
             CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
             (size_type)in_stack_fffffffffffff7f8);
  local_508 = 0;
  do {
    if (local_248 <= local_508) {
      local_540 = 0;
      do {
        if (local_250 <= local_540) {
          std::__cxx11::string::string(local_588);
          std::__cxx11::string::string(local_5a8);
          local_5b0 = 0;
          do {
            if (local_258 <= local_5b0) {
              local_5d0 = 0;
              do {
                if ((ulong)in_RDI[5] <= local_5d0) {
                  ppTVar14 = std::vector<TDNode_*,_std::allocator<TDNode_*>_>::operator[]
                                       ((vector<TDNode_*,_std::allocator<TDNode_*>_> *)(in_RDI + 10)
                                        ,0);
                  *in_RDI = (long)*ppTVar14;
                  for (local_638 = 0; local_638 < *(ulong *)(*in_RDI + 0x30);
                      local_638 = local_638 + 1) {
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               (*in_RDI + 0x38),local_638);
                    getRelation(in_stack_fffffffffffff7e0,(size_t)in_stack_fffffffffffff7d8);
                    neighborSchema((TreeDecomposition *)
                                   CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                                   in_stack_fffffffffffff7f8,
                                   CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                                   (var_bitset *)in_stack_fffffffffffff7e8);
                    std::bitset<100UL>::operator|=
                              ((bitset<100UL> *)in_stack_fffffffffffff7e0,
                               (bitset<100UL> *)in_stack_fffffffffffff7d8);
                  }
                  for (local_640 = 0; local_640 < *(ulong *)(*in_RDI + 0x30);
                      local_640 = local_640 + 1) {
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               (*in_RDI + 0x38),local_640);
                    in_stack_fffffffffffff7d8 =
                         getRelation(in_stack_fffffffffffff7e0,(size_t)in_stack_fffffffffffff7d8);
                    in_stack_fffffffffffff7e0 = *(TreeDecomposition **)(*in_RDI + 0x20);
                    std::bitset<100UL>::operator~((bitset<100UL> *)in_stack_fffffffffffff7e8);
                    std::operator&((bitset<100UL> *)in_stack_fffffffffffff7d8,
                                   (bitset<100UL> *)0x321308);
                    std::operator|((bitset<100UL> *)in_stack_fffffffffffff7d8,
                                   (bitset<100UL> *)0x321337);
                    schema.super__Base_bitset<2UL>._M_w[1] = (_WordT)in_stack_fffffffffffff820;
                    schema.super__Base_bitset<2UL>._M_w[0] = (_WordT)in_stack_fffffffffffff818;
                    parentNeighborSchema
                              ((TreeDecomposition *)
                               CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
                               in_stack_fffffffffffff808,
                               CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),schema)
                    ;
                  }
                  std::__cxx11::string::~string(local_5a8);
                  std::__cxx11::string::~string(local_588);
                  std::__cxx11::string::~string(local_500);
                  std::__cxx11::string::~string(local_4e0);
                  std::__cxx11::string::~string(local_4c0);
                  std::__cxx11::string::~string(local_4a0);
                  std::__cxx11::string::~string(local_480);
                  std::__cxx11::string::~string(local_460);
                  std::__cxx11::string::~string(local_440);
                  std::__cxx11::string::~string(local_420);
                  std::__cxx11::stringstream::~stringstream((stringstream *)local_400);
                  std::__cxx11::string::~string(local_278);
                  std::ifstream::~ifstream(local_210);
                  return;
                }
                this_00 = (vector<TDNode_*,_std::allocator<TDNode_*>_> *)(in_RDI + 10);
                ppTVar14 = std::vector<TDNode_*,_std::allocator<TDNode_*>_>::operator[]
                                     (this_00,local_5d0);
                sVar15 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                   (&(*ppTVar14)->_neighbors);
                ppTVar14 = std::vector<TDNode_*,_std::allocator<TDNode_*>_>::operator[]
                                     (this_00,local_5d0);
                (*ppTVar14)->_numOfNeighbors = sVar15;
                ppTVar14 = std::vector<TDNode_*,_std::allocator<TDNode_*>_>::operator[]
                                     (this_00,local_5d0);
                uVar1 = (*ppTVar14)->_numOfNeighbors;
                auVar2._8_8_ = 0;
                auVar2._0_8_ = uVar1;
                uVar16 = SUB168(auVar2 * ZEXT816(0x10),0);
                if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
                  uVar16 = 0xffffffffffffffff;
                }
                pbVar17 = (bitset<100UL> *)operator_new__(uVar16);
                if (uVar1 != 0) {
                  pbVar3 = pbVar17;
                  do {
                    local_7c8 = pbVar3;
                    std::bitset<100UL>::bitset((bitset<100UL> *)0x320e33);
                    pbVar3 = local_7c8 + 1;
                  } while (local_7c8 + 1 != pbVar17 + uVar1);
                }
                ppTVar14 = std::vector<TDNode_*,_std::allocator<TDNode_*>_>::operator[]
                                     ((vector<TDNode_*,_std::allocator<TDNode_*>_> *)(in_RDI + 10),
                                      local_5d0);
                (*ppTVar14)->_neighborSchema = pbVar17;
                ppTVar14 = std::vector<TDNode_*,_std::allocator<TDNode_*>_>::operator[]
                                     ((vector<TDNode_*,_std::allocator<TDNode_*>_> *)(in_RDI + 10),
                                      local_5d0);
                if (((*ppTVar14)->_numOfNeighbors == 1) || (in_RDI[5] == 1)) {
                  in_stack_fffffffffffff820 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (in_RDI + 1);
                  std::vector<TDNode_*,_std::allocator<TDNode_*>_>::operator[]
                            ((vector<TDNode_*,_std::allocator<TDNode_*>_> *)(in_RDI + 10),local_5d0)
                  ;
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                             (value_type_conflict2 *)in_stack_fffffffffffff7e8);
                }
                do {
                  do {
                    in_stack_fffffffffffff818 =
                         std::getline<char,std::char_traits<char>,std::allocator<char>>
                                   ((istream *)local_210,local_278);
                    in_stack_fffffffffffff817 =
                         std::ios::operator_cast_to_bool
                                   ((ios *)(in_stack_fffffffffffff818 +
                                           *(long *)(*(long *)in_stack_fffffffffffff818 + -0x18)));
                    if (!(bool)in_stack_fffffffffffff817) goto LAB_00320f71;
                    in_stack_fffffffffffff808 =
                         (TDNode *)std::__cxx11::string::operator[]((ulong)local_278);
                  } while ((in_stack_fffffffffffff808->_name)._M_dataplus == (_Alloc_hider)0x23);
                  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_fffffffffffff7e0,
                                          (char *)in_stack_fffffffffffff7d8);
                  in_stack_fffffffffffff804 = CONCAT13(bVar5,(int3)in_stack_fffffffffffff804);
                } while (bVar5);
LAB_00320f71:
                std::operator<<(local_3f0,local_278);
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_400,local_440,' ');
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_400,local_480,' ');
                in_stack_fffffffffffff7f8 =
                     (TDNode *)
                     std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                   *)in_stack_fffffffffffff7e0,&in_stack_fffffffffffff7d8->_name);
                local_5d4 = *(int *)&in_stack_fffffffffffff7f8->_name;
                in_stack_fffffffffffff7f4 =
                     std::__cxx11::stoi((string *)in_stack_fffffffffffff7e0,
                                        (size_t *)in_stack_fffffffffffff7d8,0);
                local_5e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (long)in_stack_fffffffffffff7f4;
                if (local_5d4 == -1) {
                  std::operator+((char *)local_7c8,in_stack_fffffffffffff820);
                  std::operator+(in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0);
                  std::operator<<((ostream *)&std::cerr,local_600);
                  std::__cxx11::string::~string(local_600);
                  std::__cxx11::string::~string(local_620);
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1 <
                    local_5e0) {
                  in_stack_fffffffffffff7e8 = local_5e0;
                  ppTVar14 = std::vector<TDNode_*,_std::allocator<TDNode_*>_>::operator[]
                                       ((vector<TDNode_*,_std::allocator<TDNode_*>_> *)(in_RDI + 10)
                                        ,(long)local_5d4);
                  (*ppTVar14)->_threads = (size_t)in_stack_fffffffffffff7e8;
                }
                std::ios::clear((long)local_400 + *(long *)(local_400[0] + -0x18),0);
                local_5d0 = local_5d0 + 1;
              } while( true );
            }
            do {
              piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 ((istream *)local_210,local_278);
              bVar5 = std::ios::operator_cast_to_bool
                                ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
              if (!bVar5) break;
              pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_278);
            } while ((*pcVar8 == '#') ||
                    (bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)in_stack_fffffffffffff7e0,
                                             (char *)in_stack_fffffffffffff7d8), bVar5));
            std::operator<<(local_3f0,local_278);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_400,local_588,'-');
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_400,local_5a8,' ');
            pmVar12 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                    *)in_stack_fffffffffffff7e0,&in_stack_fffffffffffff7d8->_name);
            local_5b4 = (int)*pmVar12;
            pmVar12 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                    *)in_stack_fffffffffffff7e0,&in_stack_fffffffffffff7d8->_name);
            local_5b8 = (int)*pmVar12;
            std::vector<TDNode_*,_std::allocator<TDNode_*>_>::operator[]
                      ((vector<TDNode_*,_std::allocator<TDNode_*>_> *)(in_RDI + 10),(long)local_5b4)
            ;
            local_5c0 = (long)local_5b8;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffff7e0,(value_type_conflict2 *)in_stack_fffffffffffff7d8);
            std::vector<TDNode_*,_std::allocator<TDNode_*>_>::operator[]
                      ((vector<TDNode_*,_std::allocator<TDNode_*>_> *)(in_RDI + 10),(long)local_5b8)
            ;
            local_5c8 = (long)local_5b4;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffff7e0,(value_type_conflict2 *)in_stack_fffffffffffff7d8);
            std::ios::clear((long)local_400 + *(long *)(local_400[0] + -0x18),0);
            local_5b0 = local_5b0 + 1;
          } while( true );
        }
        do {
          piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_210,local_278);
          bVar5 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
          if (!bVar5) break;
          pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_278);
        } while ((*pcVar8 == '#') ||
                (bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff7e0,
                                         (char *)in_stack_fffffffffffff7d8), bVar5));
        std::operator<<(local_3f0,local_278);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_400,local_4a0,' ');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_400,local_440,':');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_400,local_480,' ');
        uVar1 = local_540;
        uVar9 = std::__cxx11::stoul((string *)in_stack_fffffffffffff7e0,
                                    (size_t *)in_stack_fffffffffffff7d8,0);
        if (uVar1 != uVar9) {
          std::operator<<((ostream *)&std::cerr,
                          "Inconsistent index specified in your DTree config file.\n");
        }
        pTVar13 = (value_type)operator_new(0x70);
        local_561 = 1;
        std::__cxx11::string::string(local_560,local_440);
        TDNode::TDNode((TDNode *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
                       &in_stack_fffffffffffff808->_name,
                       CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800));
        local_561 = 0;
        ppTVar14 = std::vector<TDNode_*,_std::allocator<TDNode_*>_>::operator[]
                             ((vector<TDNode_*,_std::allocator<TDNode_*>_> *)(in_RDI + 10),local_540
                             );
        *ppTVar14 = pTVar13;
        std::__cxx11::string::~string(local_560);
        uVar1 = local_540;
        pmVar12 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                *)in_stack_fffffffffffff7e0,&in_stack_fffffffffffff7d8->_name);
        *pmVar12 = uVar1;
        std::ios::clear((long)local_400 + *(long *)(local_400[0] + -0x18),0);
        std::operator<<(local_3f0,local_480);
        while( true ) {
          piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_400,local_420,',');
          bVar5 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
          if (!bVar5) break;
          std::vector<TDNode_*,_std::allocator<TDNode_*>_>::operator[]
                    ((vector<TDNode_*,_std::allocator<TDNode_*>_> *)(in_RDI + 10),local_540);
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        *)in_stack_fffffffffffff7e0,&in_stack_fffffffffffff7d8->_name);
          std::bitset<100UL>::set
                    ((bitset<100UL> *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                     (size_t)in_stack_fffffffffffff7e8,
                     SUB81((ulong)in_stack_fffffffffffff7e0 >> 0x38,0));
        }
        std::ios::clear((long)local_400 + *(long *)(local_400[0] + -0x18),0);
        local_540 = local_540 + 1;
      } while( true );
    }
    do {
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_210,local_278);
      bVar5 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
      if (!bVar5) break;
      pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_278);
    } while ((*pcVar8 == '#') ||
            (bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff7e0,(char *)in_stack_fffffffffffff7d8)
            , bVar5));
    std::operator<<(local_3f0,local_278);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_400,local_4a0,' ');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_400,local_440,' ');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_400,local_460,' ');
    std::ios::clear((long)local_400 + *(long *)(local_400[0] + -0x18),0);
    uVar1 = local_508;
    uVar9 = std::__cxx11::stoul((string *)in_stack_fffffffffffff7e0,
                                (size_t *)in_stack_fffffffffffff7d8,0);
    if (uVar1 != uVar9) {
      std::operator<<((ostream *)&std::cerr,
                      "Inconsistent index specified in your DTree config file.\n");
    }
    local_50c = 0;
    iVar6 = std::__cxx11::string::compare((char *)local_460);
    if (iVar6 == 0) {
      local_50c = 1;
    }
    iVar6 = std::__cxx11::string::compare((char *)local_460);
    if (iVar6 == 0) {
      local_50c = 2;
    }
    iVar6 = std::__cxx11::string::compare((char *)local_460);
    if (iVar6 == 0) {
      local_50c = 3;
    }
    pAVar10 = (value_type)operator_new(0x40);
    local_531 = 1;
    std::__cxx11::string::string(local_530,local_440);
    Attribute::Attribute
              ((Attribute *)CONCAT17(in_stack_fffffffffffff817,in_stack_fffffffffffff810),
               &in_stack_fffffffffffff808->_name,in_stack_fffffffffffff804,in_stack_fffffffffffff800
              );
    local_531 = 0;
    ppAVar11 = std::vector<Attribute_*,_std::allocator<Attribute_*>_>::operator[]
                         ((vector<Attribute_*,_std::allocator<Attribute_*>_> *)(in_RDI + 7),
                          local_508);
    *ppAVar11 = pAVar10;
    std::__cxx11::string::~string(local_530);
    uVar1 = local_508;
    pmVar12 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            *)in_stack_fffffffffffff7e0,&in_stack_fffffffffffff7d8->_name);
    *pmVar12 = uVar1;
    local_508 = local_508 + 1;
  } while( true );
}

Assistant:

void TreeDecomposition::buildFromFile()
{
    /* Load the TreeDecomposition config file into an input stream. */
    std::ifstream input(multifaq::config::TREEDECOMP_CONF);

    if (!input)
    {
        ERROR(multifaq::config::TREEDECOMP_CONF+" does not exist. \n");
        exit(1);
    }

    DINFO("Building the TD from file: " << multifaq::config::TREEDECOMP_CONF << " ... ");
   
    /* Number of attributes and tables. */
    size_t n, m, e;

    /* String and associated stream to receive lines from the file. */
    std::string line;
    std::stringstream ssLine;

    /* String to receive the attributes from the relation. */
    std::string attribute;

    /* Read all the attributes - name and value - and parent and key. */
    std::string name;
    std::string type;
    std::string attrs;
    std::string index;
    
    /* Skmaip any comments at the top */
    while (getline(input, line))
    {
        if (line[0] == COMMENT_CHAR || line == "")
            continue;
    
        break;
    }

    /* Extract number of attributes and tables. */
    ssLine << line;

    std::string nString, mString, eString;
    getline(ssLine, nString, PARAMETER_SEPARATOR_CHAR);
    getline(ssLine, mString, PARAMETER_SEPARATOR_CHAR);
    getline(ssLine, eString, PARAMETER_SEPARATOR_CHAR);
   
    ssLine.clear();

    /* Convert the strings to integers. */
    n = stoul(nString);
    m = stoul(mString);
    e = stoul(eString);

    /* Set numOfAttributes and _numOfRelations. */
    this->_numOfAttributes = n;
    this->_numOfRelations = m;
    this->_numOfEdges = e;

    this->_relations.resize(m);
    // this->_attributesInRelation.resize(m);
    this->_attributes.resize(n);
   
    for (size_t i = 0; i < n; ++i)
    {
        /* Extract node information for each attribute. */
        while (getline(input, line))
        {
            if (line[0] == COMMENT_CHAR || line == "")
                continue;

            break;
        }

        ssLine << line;

        /* Get the six parameters specified for each attribute. */
        getline(ssLine, index, PARAMETER_SEPARATOR_CHAR);
        getline(ssLine, name, PARAMETER_SEPARATOR_CHAR);
        getline(ssLine, type, PARAMETER_SEPARATOR_CHAR);

        /* Clear string stream. */
        ssLine.clear();

        if (i != stoul(index))
            ERROR("Inconsistent index specified in your DTree config file.\n");

        Type t = Type::Integer;        
        if (type.compare("double")==0) t = Type::Double;
        if (type.compare("short")==0) t = Type::Short;
        if (type.compare("uint")==0) t = Type::U_Integer;
        
        this->_attributes[i] = new Attribute(name, i, t);
        this->_attributeMap[name] = i;
    }
  
    /* Read all the node names, their parents and attributes. */
    for (size_t i = 0; i < m; ++i)
    {
        /* Extract node information for each relation. */
        while (getline(input, line))
        {
           if (line[0] == COMMENT_CHAR || line == "")
              continue;

           break;
        }

        ssLine << line;

        /* Get the three parameters specified for each relation. */
        // getline(ssLine, name, PARAMETER_SEPARATOR_CHAR);
        // getline(ssLine, parent, PARAMETER_SEPARATOR_CHAR);

        getline(ssLine, index, PARAMETER_SEPARATOR_CHAR);
        getline(ssLine, name, NAME_SEPARATOR_CHAR);
        getline(ssLine, attrs, PARAMETER_SEPARATOR_CHAR);

        if (i != stoul(index))
            ERROR("Inconsistent index specified in your DTree config file.\n");

#ifdef PRINT_TD
        DINFO( index << " " << name << " " << attrs << "\n");
#endif
        this->_relations[i] = new TDNode(name, i);
        this->_relationsMap[name] = i;

        /* Clear string stream. */
        ssLine.clear();

        ssLine << attrs;

        while (getline(ssLine, attribute, ATTRIBUTE_SEPARATOR_CHAR))
            this->_relations[i]->_bag.set(_attributeMap[attribute]);
        
        /* Clear string stream. */
        ssLine.clear();
    }

    std::string node1, node2;
    
    /* Read all the node names, their parents and attributes. */
    for (size_t i = 0; i < e; ++i)
    {
        /* Extract node information for each relation. */
        while (getline(input, line))
        {
           if (line[0] == COMMENT_CHAR || line == "")
              continue;

           break;
        }

        ssLine << line;

        getline(ssLine, node1, EDGE_SEPARATOR_CHAR);
        getline(ssLine, node2, PARAMETER_SEPARATOR_CHAR);

#ifdef PRINT_TD
        DINFO( node1 << " - " << node2 << "\n");
#endif

        int n1 = _relationsMap[node1];
        int n2 = _relationsMap[node2];

        _relations[n1]->_neighbors.push_back(n2);
        _relations[n2]->_neighbors.push_back(n1);

        ssLine.clear();
    }
    
    for (size_t i = 0; i < _numOfRelations; i++)
    {
        _relations[i]->_numOfNeighbors = _relations[i]->_neighbors.size();
        _relations[i]->_neighborSchema = new var_bitset[_relations[i]->_numOfNeighbors];
        
        if (_relations[i]->_numOfNeighbors == 1 || _numOfRelations == 1)
            _leafNodes.push_back(_relations[i]->_id);


        /* Extract node information for each relation. */
        while (getline(input, line))
        {
            if (line[0] == COMMENT_CHAR || line == "")
                continue;

            break;
        }

        ssLine << line;

        getline(ssLine, name, PARAMETER_SEPARATOR_CHAR);
        getline(ssLine, attrs, PARAMETER_SEPARATOR_CHAR);

#ifdef PRINT_TD        
        DINFO( name << " - " << attrs << "\n");
#endif
        int relID = _relationsMap[name];
        size_t threads = std::stoi(attrs);

        if (relID == -1)
            ERROR("The relation "+name+" was not found\n");
        
        if (threads > 1)
        {
            this->_relations[relID]->_threads = threads;
        }
        
        ssLine.clear();
    }
    
    // We are computing the schema!    
    this->_root = _relations[0];
    var_bitset rootSchemaBitset = _root->_bag;
    
    /* Setting neighborSchema for root node! */
    for (size_t n = 0; n < _root->_numOfNeighbors; n++)
    {
        neighborSchema(getRelation(_root->_neighbors[n]), _root->_id,
                       _root->_neighborSchema[n]);

        rootSchemaBitset |= _root->_neighborSchema[n];
    }

    /* Propagating schema down */
    for (size_t n = 0; n < _root->_numOfNeighbors; n++)
    {
        parentNeighborSchema(
            getRelation(_root->_neighbors[n]), _root->_id,
            (rootSchemaBitset & ~_root->_neighborSchema[n]) | _root->_bag);
    }
 
    // for (size_t i = 0; i < _numOfRelations; i++)
    // {
    //     printf("node: %s : ", getRelation(i)->_name.c_str());
    //     std::cout << getRelation(i)->_bag << "\n";
    //     for (size_t c = 0; c < getRelation(i)->_numOfNeighbors; c++)
    //         std::cout <<getRelation(i)->_neighborSchema[c] << " | ";
    //     std::cout << "\n";
    // }
}